

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O1

void new_offset(File *fp,char *name)

{
  undefined8 *t;
  size_t sVar1;
  
  t = (undefined8 *)malloc(0x10);
  *t = 0;
  t[1] = 0;
  *t = name;
  *(int *)((long)t + 0xc) = *(int *)&(fp->tables).cur - *(int *)&(fp->tables).start;
  sVar1 = strlen(name);
  *(int *)(t + 1) = (int)sVar1;
  set_add_fn(&fp->entries,t,&offset_fns);
  return;
}

Assistant:

static void new_offset(File *fp, char *name) {
  OffsetEntry *entry = MALLOC(sizeof(OffsetEntry));
  memset(entry, 0, sizeof(OffsetEntry));
  entry->name = name;
  entry->offset = fp->tables.cur - fp->tables.start;
  entry->len = strlen(name);
  set_add_fn(&fp->entries, entry, &offset_fns);
}